

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  NodeRef *pNVar52;
  undefined4 uVar53;
  ulong unaff_R12;
  size_t mask;
  uint uVar54;
  bool bVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  UVIdentity<4> mapUV;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 *local_1598;
  ulong local_1590;
  ulong local_1588;
  NodeRef *local_1580;
  RTCFilterFunctionNArguments args;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined1 local_1448 [16];
  undefined1 local_1438 [16];
  UVIdentity<4> *local_1428;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 local_13b8 [16];
  RTCHitN local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  uint local_1338;
  uint uStack_1334;
  uint uStack_1330;
  uint uStack_132c;
  uint uStack_1328;
  uint uStack_1324;
  uint uStack_1320;
  uint uStack_131c;
  undefined1 local_1318 [32];
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  int iStack_12e8;
  int iStack_12e4;
  int iStack_12e0;
  int iStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float fStack_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined4 local_11f8;
  undefined4 uStack_11f4;
  undefined4 uStack_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined4 uStack_11e0;
  undefined4 uStack_11dc;
  NodeRef stack [564];
  
  stack[0] = root;
  uVar53 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar96._4_4_ = uVar53;
  auVar96._0_4_ = uVar53;
  auVar96._8_4_ = uVar53;
  auVar96._12_4_ = uVar53;
  auVar96._16_4_ = uVar53;
  auVar96._20_4_ = uVar53;
  auVar96._24_4_ = uVar53;
  auVar96._28_4_ = uVar53;
  local_11f8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  uStack_11f4 = local_11f8;
  uStack_11f0 = local_11f8;
  uStack_11ec = local_11f8;
  uStack_11e8 = local_11f8;
  uStack_11e4 = local_11f8;
  uStack_11e0 = local_11f8;
  uStack_11dc = local_11f8;
  local_1218 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_1214 = local_1218;
  uStack_1210 = local_1218;
  uStack_120c = local_1218;
  uStack_1208 = local_1218;
  uStack_1204 = local_1218;
  uStack_1200 = local_1218;
  uStack_11fc = local_1218;
  local_1298 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12b8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12d8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1238 = local_1298 * 0.99999964;
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  fStack_1228 = local_1238;
  fStack_1224 = local_1238;
  fStack_1220 = local_1238;
  fStack_121c = local_1238;
  fVar26 = local_12b8 * 0.99999964;
  local_1258._4_4_ = fVar26;
  local_1258._0_4_ = fVar26;
  fStack_1250 = fVar26;
  fStack_124c = fVar26;
  fStack_1248 = fVar26;
  fStack_1244 = fVar26;
  fStack_1240 = fVar26;
  register0x0000131c = fVar26;
  local_1278 = local_12d8 * 0.99999964;
  fStack_1274 = local_1278;
  fStack_1270 = local_1278;
  fStack_126c = local_1278;
  fStack_1268 = local_1278;
  fStack_1264 = local_1278;
  fStack_1260 = local_1278;
  fStack_125c = local_1278;
  local_1298 = local_1298 * 1.0000004;
  fStack_1294 = local_1298;
  fStack_1290 = local_1298;
  fStack_128c = local_1298;
  fStack_1288 = local_1298;
  fStack_1284 = local_1298;
  fStack_1280 = local_1298;
  fStack_127c = local_1298;
  local_12b8 = local_12b8 * 1.0000004;
  fStack_12b4 = local_12b8;
  fStack_12b0 = local_12b8;
  fStack_12ac = local_12b8;
  fStack_12a8 = local_12b8;
  fStack_12a4 = local_12b8;
  fStack_12a0 = local_12b8;
  fStack_129c = local_12b8;
  local_12d8 = local_12d8 * 1.0000004;
  fStack_12d4 = local_12d8;
  fStack_12d0 = local_12d8;
  fStack_12cc = local_12d8;
  fStack_12c8 = local_12d8;
  fStack_12c4 = local_12d8;
  fStack_12c0 = local_12d8;
  fStack_12bc = local_12d8;
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12f8 = (tray->tnear).field_0.i[k];
  iStack_12f4 = local_12f8;
  iStack_12f0 = local_12f8;
  iStack_12ec = local_12f8;
  iStack_12e8 = local_12f8;
  iStack_12e4 = local_12f8;
  iStack_12e0 = local_12f8;
  iStack_12dc = local_12f8;
  uVar49 = uVar51 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  local_1318._4_4_ = iVar2;
  local_1318._0_4_ = iVar2;
  local_1318._8_4_ = iVar2;
  local_1318._12_4_ = iVar2;
  local_1318._16_4_ = iVar2;
  local_1318._20_4_ = iVar2;
  local_1318._24_4_ = iVar2;
  local_1318._28_4_ = iVar2;
  local_1598 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  pNVar52 = stack + 1;
  do {
    local_1580 = pNVar52;
    if (local_1580 == stack) break;
    pNVar52 = local_1580 + -1;
    uVar48 = local_1580[-1].ptr;
    do {
      if ((uVar48 & 8) == 0) {
        auVar27 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar46),auVar96);
        auVar28._4_4_ = auVar27._4_4_ * fStack_1234;
        auVar28._0_4_ = auVar27._0_4_ * local_1238;
        auVar28._8_4_ = auVar27._8_4_ * fStack_1230;
        auVar28._12_4_ = auVar27._12_4_ * fStack_122c;
        auVar28._16_4_ = auVar27._16_4_ * fStack_1228;
        auVar28._20_4_ = auVar27._20_4_ * fStack_1224;
        auVar28._24_4_ = auVar27._24_4_ * fStack_1220;
        auVar28._28_4_ = auVar27._28_4_;
        auVar42._4_4_ = uStack_11f4;
        auVar42._0_4_ = local_11f8;
        auVar42._8_4_ = uStack_11f0;
        auVar42._12_4_ = uStack_11ec;
        auVar42._16_4_ = uStack_11e8;
        auVar42._20_4_ = uStack_11e4;
        auVar42._24_4_ = uStack_11e0;
        auVar42._28_4_ = uStack_11dc;
        auVar27 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar50),auVar42);
        auVar29._4_4_ = auVar27._4_4_ * (float)local_1258._4_4_;
        auVar29._0_4_ = auVar27._0_4_ * (float)local_1258._0_4_;
        auVar29._8_4_ = auVar27._8_4_ * fStack_1250;
        auVar29._12_4_ = auVar27._12_4_ * fStack_124c;
        auVar29._16_4_ = auVar27._16_4_ * fStack_1248;
        auVar29._20_4_ = auVar27._20_4_ * fStack_1244;
        auVar29._24_4_ = auVar27._24_4_ * fStack_1240;
        auVar29._28_4_ = auVar27._28_4_;
        auVar27 = vmaxps_avx(auVar28,auVar29);
        auVar41._4_4_ = uStack_1214;
        auVar41._0_4_ = local_1218;
        auVar41._8_4_ = uStack_1210;
        auVar41._12_4_ = uStack_120c;
        auVar41._16_4_ = uStack_1208;
        auVar41._20_4_ = uStack_1204;
        auVar41._24_4_ = uStack_1200;
        auVar41._28_4_ = uStack_11fc;
        auVar28 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar51),auVar41);
        auVar30._4_4_ = auVar28._4_4_ * fStack_1274;
        auVar30._0_4_ = auVar28._0_4_ * local_1278;
        auVar30._8_4_ = auVar28._8_4_ * fStack_1270;
        auVar30._12_4_ = auVar28._12_4_ * fStack_126c;
        auVar30._16_4_ = auVar28._16_4_ * fStack_1268;
        auVar30._20_4_ = auVar28._20_4_ * fStack_1264;
        auVar30._24_4_ = auVar28._24_4_ * fStack_1260;
        auVar30._28_4_ = auVar28._28_4_;
        auVar40._4_4_ = iStack_12f4;
        auVar40._0_4_ = local_12f8;
        auVar40._8_4_ = iStack_12f0;
        auVar40._12_4_ = iStack_12ec;
        auVar40._16_4_ = iStack_12e8;
        auVar40._20_4_ = iStack_12e4;
        auVar40._24_4_ = iStack_12e0;
        auVar40._28_4_ = iStack_12dc;
        auVar28 = vmaxps_avx(auVar30,auVar40);
        auVar27 = vmaxps_avx(auVar27,auVar28);
        auVar28 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + (uVar46 ^ 0x20)),auVar96);
        auVar31._4_4_ = auVar28._4_4_ * fStack_1294;
        auVar31._0_4_ = auVar28._0_4_ * local_1298;
        auVar31._8_4_ = auVar28._8_4_ * fStack_1290;
        auVar31._12_4_ = auVar28._12_4_ * fStack_128c;
        auVar31._16_4_ = auVar28._16_4_ * fStack_1288;
        auVar31._20_4_ = auVar28._20_4_ * fStack_1284;
        auVar31._24_4_ = auVar28._24_4_ * fStack_1280;
        auVar31._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + (uVar50 ^ 0x20)),auVar42);
        auVar32._4_4_ = auVar28._4_4_ * fStack_12b4;
        auVar32._0_4_ = auVar28._0_4_ * local_12b8;
        auVar32._8_4_ = auVar28._8_4_ * fStack_12b0;
        auVar32._12_4_ = auVar28._12_4_ * fStack_12ac;
        auVar32._16_4_ = auVar28._16_4_ * fStack_12a8;
        auVar32._20_4_ = auVar28._20_4_ * fStack_12a4;
        auVar32._24_4_ = auVar28._24_4_ * fStack_12a0;
        auVar32._28_4_ = auVar28._28_4_;
        auVar28 = vminps_avx(auVar31,auVar32);
        auVar29 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar49),auVar41);
        auVar33._4_4_ = auVar29._4_4_ * fStack_12d4;
        auVar33._0_4_ = auVar29._0_4_ * local_12d8;
        auVar33._8_4_ = auVar29._8_4_ * fStack_12d0;
        auVar33._12_4_ = auVar29._12_4_ * fStack_12cc;
        auVar33._16_4_ = auVar29._16_4_ * fStack_12c8;
        auVar33._20_4_ = auVar29._20_4_ * fStack_12c4;
        auVar33._24_4_ = auVar29._24_4_ * fStack_12c0;
        auVar33._28_4_ = auVar29._28_4_;
        auVar29 = vminps_avx(auVar33,local_1318);
        auVar28 = vminps_avx(auVar28,auVar29);
        auVar27 = vcmpps_avx(auVar27,auVar28,2);
        uVar53 = vmovmskps_avx(auVar27);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar53);
      }
      if ((uVar48 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar54 = 4;
        }
        else {
          uVar47 = uVar48 & 0xfffffffffffffff0;
          lVar44 = 0;
          for (uVar48 = unaff_R12; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
            lVar44 = lVar44 + 1;
          }
          uVar54 = 0;
          for (uVar43 = unaff_R12 - 1 & unaff_R12; uVar48 = *(ulong *)(uVar47 + lVar44 * 8),
              uVar43 != 0; uVar43 = uVar43 - 1 & uVar43) {
            pNVar52->ptr = uVar48;
            pNVar52 = pNVar52 + 1;
            lVar44 = 0;
            for (uVar48 = uVar43; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar44 = lVar44 + 1;
            }
          }
        }
      }
      else {
        uVar54 = 6;
      }
    } while (uVar54 == 0);
    if (uVar54 == 6) {
      uVar54 = 0;
      local_1590 = (ulong)((uint)uVar48 & 0xf) - 8;
      bVar55 = local_1590 != 0;
      if (bVar55) {
        uVar48 = uVar48 & 0xfffffffffffffff0;
        local_1588 = 0;
        uVar47 = uVar49;
        do {
          lVar44 = local_1588 * 0x50;
          pSVar6 = context->scene;
          ppfVar7 = (pSVar6->vertices).items;
          pfVar8 = ppfVar7[*(uint *)(uVar48 + 0x30 + lVar44)];
          pfVar9 = ppfVar7[*(uint *)(uVar48 + 0x34 + lVar44)];
          pfVar10 = ppfVar7[*(uint *)(uVar48 + 0x38 + lVar44)];
          pfVar11 = ppfVar7[*(uint *)(uVar48 + 0x3c + lVar44)];
          auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + lVar44)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 8 + lVar44)));
          auVar62 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + lVar44)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 8 + lVar44)));
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 4 + lVar44)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0xc + lVar44))
                                 );
          auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 4 + lVar44)),
                                  *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0xc + lVar44))
                                 );
          auVar82 = vunpcklps_avx(auVar62,auVar87);
          auVar92 = vunpcklps_avx(auVar63,auVar91);
          auVar62 = vunpckhps_avx(auVar63,auVar91);
          auVar91 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x10 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar48 + 0x18 + lVar44)));
          auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x10 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar48 + 0x18 + lVar44)));
          auVar97 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x14 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar48 + 0x1c + lVar44)));
          auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x14 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar48 + 0x1c + lVar44)));
          auVar83 = vunpcklps_avx(auVar87,auVar63);
          auVar79 = vunpcklps_avx(auVar91,auVar97);
          auVar63 = vunpckhps_avx(auVar91,auVar97);
          auVar97 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x20 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar48 + 0x28 + lVar44)));
          auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar48 + 0x20 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar48 + 0x28 + lVar44)));
          auVar78 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x24 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar48 + 0x2c + lVar44)));
          auVar91 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar48 + 0x24 + lVar44))
                                  ,*(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar48 + 0x2c + lVar44)));
          auVar77 = vunpcklps_avx(auVar87,auVar91);
          auVar85 = vunpcklps_avx(auVar97,auVar78);
          auVar78 = vunpckhps_avx(auVar97,auVar78);
          puVar1 = (undefined8 *)(uVar48 + 0x30 + lVar44);
          local_1468 = *puVar1;
          uStack_1460 = puVar1[1];
          puVar1 = (undefined8 *)(uVar48 + 0x40 + lVar44);
          local_1478 = *puVar1;
          uStack_1470 = puVar1[1];
          local_1428 = &mapUV;
          uVar53 = *(undefined4 *)(ray + k * 4);
          auVar97._4_4_ = uVar53;
          auVar97._0_4_ = uVar53;
          auVar97._8_4_ = uVar53;
          auVar97._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar99._4_4_ = uVar53;
          auVar99._0_4_ = uVar53;
          auVar99._8_4_ = uVar53;
          auVar99._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar101._4_4_ = uVar53;
          auVar101._0_4_ = uVar53;
          auVar101._8_4_ = uVar53;
          auVar101._12_4_ = uVar53;
          auVar91 = vsubps_avx(auVar92,auVar97);
          auVar92 = vsubps_avx(auVar62,auVar99);
          auVar62 = vsubps_avx(auVar82,auVar101);
          auVar87 = vsubps_avx(auVar79,auVar97);
          auVar63 = vsubps_avx(auVar63,auVar99);
          auVar82 = vsubps_avx(auVar83,auVar101);
          auVar97 = vsubps_avx(auVar85,auVar97);
          auVar78 = vsubps_avx(auVar78,auVar99);
          auVar83 = vsubps_avx(auVar77,auVar101);
          auVar79 = vsubps_avx(auVar97,auVar91);
          auVar77 = vsubps_avx(auVar78,auVar92);
          auVar85 = vsubps_avx(auVar83,auVar62);
          auVar57._0_4_ = auVar97._0_4_ + auVar91._0_4_;
          auVar57._4_4_ = auVar97._4_4_ + auVar91._4_4_;
          auVar57._8_4_ = auVar97._8_4_ + auVar91._8_4_;
          auVar57._12_4_ = auVar97._12_4_ + auVar91._12_4_;
          auVar69._0_4_ = auVar78._0_4_ + auVar92._0_4_;
          auVar69._4_4_ = auVar78._4_4_ + auVar92._4_4_;
          auVar69._8_4_ = auVar78._8_4_ + auVar92._8_4_;
          auVar69._12_4_ = auVar78._12_4_ + auVar92._12_4_;
          fVar14 = auVar62._0_4_;
          auVar71._0_4_ = auVar83._0_4_ + fVar14;
          fVar15 = auVar62._4_4_;
          auVar71._4_4_ = auVar83._4_4_ + fVar15;
          fVar16 = auVar62._8_4_;
          auVar71._8_4_ = auVar83._8_4_ + fVar16;
          fVar17 = auVar62._12_4_;
          auVar71._12_4_ = auVar83._12_4_ + fVar17;
          auVar100._0_4_ = auVar85._0_4_ * auVar69._0_4_;
          auVar100._4_4_ = auVar85._4_4_ * auVar69._4_4_;
          auVar100._8_4_ = auVar85._8_4_ * auVar69._8_4_;
          auVar100._12_4_ = auVar85._12_4_ * auVar69._12_4_;
          auVar99 = vfmsub231ps_fma(auVar100,auVar77,auVar71);
          auVar72._0_4_ = auVar79._0_4_ * auVar71._0_4_;
          auVar72._4_4_ = auVar79._4_4_ * auVar71._4_4_;
          auVar72._8_4_ = auVar79._8_4_ * auVar71._8_4_;
          auVar72._12_4_ = auVar79._12_4_ * auVar71._12_4_;
          auVar71 = vfmsub231ps_fma(auVar72,auVar85,auVar57);
          auVar58._0_4_ = auVar77._0_4_ * auVar57._0_4_;
          auVar58._4_4_ = auVar77._4_4_ * auVar57._4_4_;
          auVar58._8_4_ = auVar77._8_4_ * auVar57._8_4_;
          auVar58._12_4_ = auVar77._12_4_ * auVar57._12_4_;
          auVar57 = vfmsub231ps_fma(auVar58,auVar79,auVar69);
          fVar26 = *(float *)(ray + k * 4 + 0x60);
          auVar66._0_4_ = fVar26 * auVar57._0_4_;
          auVar66._4_4_ = fVar26 * auVar57._4_4_;
          auVar66._8_4_ = fVar26 * auVar57._8_4_;
          auVar66._12_4_ = fVar26 * auVar57._12_4_;
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar93._4_4_ = uVar53;
          auVar93._0_4_ = uVar53;
          auVar93._8_4_ = uVar53;
          auVar93._12_4_ = uVar53;
          auVar71 = vfmadd231ps_fma(auVar66,auVar93,auVar71);
          uVar53 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar102._4_4_ = uVar53;
          auVar102._0_4_ = uVar53;
          auVar102._8_4_ = uVar53;
          auVar102._12_4_ = uVar53;
          auVar66 = vfmadd231ps_fma(auVar71,auVar102,auVar99);
          auVar71 = vsubps_avx(auVar92,auVar63);
          auVar99 = vsubps_avx(auVar62,auVar82);
          auVar70._0_4_ = auVar92._0_4_ + auVar63._0_4_;
          auVar70._4_4_ = auVar92._4_4_ + auVar63._4_4_;
          auVar70._8_4_ = auVar92._8_4_ + auVar63._8_4_;
          auVar70._12_4_ = auVar92._12_4_ + auVar63._12_4_;
          auVar73._0_4_ = auVar82._0_4_ + fVar14;
          auVar73._4_4_ = auVar82._4_4_ + fVar15;
          auVar73._8_4_ = auVar82._8_4_ + fVar16;
          auVar73._12_4_ = auVar82._12_4_ + fVar17;
          fVar18 = auVar99._0_4_;
          auVar80._0_4_ = auVar70._0_4_ * fVar18;
          fVar20 = auVar99._4_4_;
          auVar80._4_4_ = auVar70._4_4_ * fVar20;
          fVar22 = auVar99._8_4_;
          auVar80._8_4_ = auVar70._8_4_ * fVar22;
          fVar24 = auVar99._12_4_;
          auVar80._12_4_ = auVar70._12_4_ * fVar24;
          auVar58 = vfmsub231ps_fma(auVar80,auVar71,auVar73);
          auVar57 = vsubps_avx(auVar91,auVar87);
          fVar103 = auVar57._0_4_;
          auVar86._0_4_ = fVar103 * auVar73._0_4_;
          fVar105 = auVar57._4_4_;
          auVar86._4_4_ = fVar105 * auVar73._4_4_;
          fVar106 = auVar57._8_4_;
          auVar86._8_4_ = fVar106 * auVar73._8_4_;
          fVar107 = auVar57._12_4_;
          auVar86._12_4_ = fVar107 * auVar73._12_4_;
          auVar74._0_4_ = auVar87._0_4_ + auVar91._0_4_;
          auVar74._4_4_ = auVar87._4_4_ + auVar91._4_4_;
          auVar74._8_4_ = auVar87._8_4_ + auVar91._8_4_;
          auVar74._12_4_ = auVar87._12_4_ + auVar91._12_4_;
          auVar62 = vfmsub231ps_fma(auVar86,auVar99,auVar74);
          fVar19 = auVar71._0_4_;
          auVar75._0_4_ = auVar74._0_4_ * fVar19;
          fVar21 = auVar71._4_4_;
          auVar75._4_4_ = auVar74._4_4_ * fVar21;
          fVar23 = auVar71._8_4_;
          auVar75._8_4_ = auVar74._8_4_ * fVar23;
          fVar25 = auVar71._12_4_;
          auVar75._12_4_ = auVar74._12_4_ * fVar25;
          auVar59 = vfmsub231ps_fma(auVar75,auVar57,auVar70);
          auVar76._0_4_ = fVar26 * auVar59._0_4_;
          auVar76._4_4_ = fVar26 * auVar59._4_4_;
          auVar76._8_4_ = fVar26 * auVar59._8_4_;
          auVar76._12_4_ = fVar26 * auVar59._12_4_;
          auVar62 = vfmadd231ps_fma(auVar76,auVar93,auVar62);
          local_1448 = vfmadd231ps_fma(auVar62,auVar102,auVar58);
          auVar58 = vsubps_avx(auVar87,auVar97);
          auVar81._0_4_ = auVar87._0_4_ + auVar97._0_4_;
          auVar81._4_4_ = auVar87._4_4_ + auVar97._4_4_;
          auVar81._8_4_ = auVar87._8_4_ + auVar97._8_4_;
          auVar81._12_4_ = auVar87._12_4_ + auVar97._12_4_;
          auVar97 = vsubps_avx(auVar63,auVar78);
          auVar59._0_4_ = auVar63._0_4_ + auVar78._0_4_;
          auVar59._4_4_ = auVar63._4_4_ + auVar78._4_4_;
          auVar59._8_4_ = auVar63._8_4_ + auVar78._8_4_;
          auVar59._12_4_ = auVar63._12_4_ + auVar78._12_4_;
          auVar78 = vsubps_avx(auVar82,auVar83);
          auVar62._0_4_ = auVar82._0_4_ + auVar83._0_4_;
          auVar62._4_4_ = auVar82._4_4_ + auVar83._4_4_;
          auVar62._8_4_ = auVar82._8_4_ + auVar83._8_4_;
          auVar62._12_4_ = auVar82._12_4_ + auVar83._12_4_;
          auVar87._0_4_ = auVar59._0_4_ * auVar78._0_4_;
          auVar87._4_4_ = auVar59._4_4_ * auVar78._4_4_;
          auVar87._8_4_ = auVar59._8_4_ * auVar78._8_4_;
          auVar87._12_4_ = auVar59._12_4_ * auVar78._12_4_;
          auVar87 = vfmsub231ps_fma(auVar87,auVar97,auVar62);
          auVar63._0_4_ = auVar62._0_4_ * auVar58._0_4_;
          auVar63._4_4_ = auVar62._4_4_ * auVar58._4_4_;
          auVar63._8_4_ = auVar62._8_4_ * auVar58._8_4_;
          auVar63._12_4_ = auVar62._12_4_ * auVar58._12_4_;
          auVar62 = vfmsub231ps_fma(auVar63,auVar78,auVar81);
          auVar82._0_4_ = auVar97._0_4_ * auVar81._0_4_;
          auVar82._4_4_ = auVar97._4_4_ * auVar81._4_4_;
          auVar82._8_4_ = auVar97._8_4_ * auVar81._8_4_;
          auVar82._12_4_ = auVar97._12_4_ * auVar81._12_4_;
          auVar63 = vfmsub231ps_fma(auVar82,auVar58,auVar59);
          auVar83._0_4_ = fVar26 * auVar63._0_4_;
          auVar83._4_4_ = fVar26 * auVar63._4_4_;
          auVar83._8_4_ = fVar26 * auVar63._8_4_;
          auVar83._12_4_ = fVar26 * auVar63._12_4_;
          auVar62 = vfmadd231ps_fma(auVar83,auVar93,auVar62);
          auVar82 = vfmadd231ps_fma(auVar62,auVar102,auVar87);
          local_1458 = auVar66._0_4_;
          fStack_1454 = auVar66._4_4_;
          fStack_1450 = auVar66._8_4_;
          fStack_144c = auVar66._12_4_;
          local_1438._0_4_ = auVar82._0_4_ + local_1458 + local_1448._0_4_;
          local_1438._4_4_ = auVar82._4_4_ + fStack_1454 + local_1448._4_4_;
          local_1438._8_4_ = auVar82._8_4_ + fStack_1450 + local_1448._8_4_;
          local_1438._12_4_ = auVar82._12_4_ + fStack_144c + local_1448._12_4_;
          auVar104._8_4_ = 0x7fffffff;
          auVar104._0_8_ = 0x7fffffff7fffffff;
          auVar104._12_4_ = 0x7fffffff;
          auVar62 = vminps_avx(auVar66,local_1448);
          auVar87 = vminps_avx(auVar62,auVar82);
          auVar62 = vandps_avx(local_1438,auVar104);
          auVar94._0_4_ = auVar62._0_4_ * 1.1920929e-07;
          auVar94._4_4_ = auVar62._4_4_ * 1.1920929e-07;
          auVar94._8_4_ = auVar62._8_4_ * 1.1920929e-07;
          auVar94._12_4_ = auVar62._12_4_ * 1.1920929e-07;
          uVar43 = CONCAT44(auVar94._4_4_,auVar94._0_4_);
          auVar88._0_8_ = uVar43 ^ 0x8000000080000000;
          auVar88._8_4_ = -auVar94._8_4_;
          auVar88._12_4_ = -auVar94._12_4_;
          auVar87 = vcmpps_avx(auVar87,auVar88,5);
          auVar63 = vmaxps_avx(auVar66,local_1448);
          auVar63 = vmaxps_avx(auVar63,auVar82);
          auVar63 = vcmpps_avx(auVar63,auVar94,2);
          auVar87 = vorps_avx(auVar87,auVar63);
          if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar87[0xf] < '\0') {
            auVar64._0_4_ = fVar19 * auVar85._0_4_;
            auVar64._4_4_ = fVar21 * auVar85._4_4_;
            auVar64._8_4_ = fVar23 * auVar85._8_4_;
            auVar64._12_4_ = fVar25 * auVar85._12_4_;
            auVar84._0_4_ = fVar103 * auVar77._0_4_;
            auVar84._4_4_ = fVar105 * auVar77._4_4_;
            auVar84._8_4_ = fVar106 * auVar77._8_4_;
            auVar84._12_4_ = fVar107 * auVar77._12_4_;
            auVar83 = vfmsub213ps_fma(auVar77,auVar99,auVar64);
            auVar89._0_4_ = auVar97._0_4_ * fVar18;
            auVar89._4_4_ = auVar97._4_4_ * fVar20;
            auVar89._8_4_ = auVar97._8_4_ * fVar22;
            auVar89._12_4_ = auVar97._12_4_ * fVar24;
            auVar95._0_4_ = fVar103 * auVar78._0_4_;
            auVar95._4_4_ = fVar105 * auVar78._4_4_;
            auVar95._8_4_ = fVar106 * auVar78._8_4_;
            auVar95._12_4_ = fVar107 * auVar78._12_4_;
            auVar78 = vfmsub213ps_fma(auVar78,auVar71,auVar89);
            auVar63 = vandps_avx(auVar104,auVar64);
            auVar82 = vandps_avx(auVar104,auVar89);
            auVar63 = vcmpps_avx(auVar63,auVar82,1);
            local_13d8 = vblendvps_avx(auVar78,auVar83,auVar63);
            auVar77._0_4_ = fVar19 * auVar58._0_4_;
            auVar77._4_4_ = fVar21 * auVar58._4_4_;
            auVar77._8_4_ = fVar23 * auVar58._8_4_;
            auVar77._12_4_ = fVar25 * auVar58._12_4_;
            auVar78 = vfmsub213ps_fma(auVar58,auVar99,auVar95);
            auVar90._0_4_ = auVar79._0_4_ * fVar18;
            auVar90._4_4_ = auVar79._4_4_ * fVar20;
            auVar90._8_4_ = auVar79._8_4_ * fVar22;
            auVar90._12_4_ = auVar79._12_4_ * fVar24;
            auVar83 = vfmsub213ps_fma(auVar85,auVar57,auVar90);
            auVar63 = vandps_avx(auVar104,auVar90);
            auVar82 = vandps_avx(auVar95,auVar104);
            auVar63 = vcmpps_avx(auVar63,auVar82,1);
            local_13c8 = vblendvps_avx(auVar78,auVar83,auVar63);
            auVar78 = vfmsub213ps_fma(auVar79,auVar71,auVar84);
            auVar97 = vfmsub213ps_fma(auVar97,auVar57,auVar77);
            auVar63 = vandps_avx(auVar104,auVar84);
            auVar82 = vandps_avx(auVar104,auVar77);
            auVar63 = vcmpps_avx(auVar63,auVar82,1);
            local_13b8 = vblendvps_avx(auVar97,auVar78,auVar63);
            auVar78._0_4_ = local_13b8._0_4_ * fVar26;
            auVar78._4_4_ = local_13b8._4_4_ * fVar26;
            auVar78._8_4_ = local_13b8._8_4_ * fVar26;
            auVar78._12_4_ = local_13b8._12_4_ * fVar26;
            auVar63 = vfmadd213ps_fma(auVar93,local_13c8,auVar78);
            auVar63 = vfmadd213ps_fma(auVar102,local_13d8,auVar63);
            auVar79._0_4_ = auVar63._0_4_ + auVar63._0_4_;
            auVar79._4_4_ = auVar63._4_4_ + auVar63._4_4_;
            auVar79._8_4_ = auVar63._8_4_ + auVar63._8_4_;
            auVar79._12_4_ = auVar63._12_4_ + auVar63._12_4_;
            auVar85._0_4_ = local_13b8._0_4_ * fVar14;
            auVar85._4_4_ = local_13b8._4_4_ * fVar15;
            auVar85._8_4_ = local_13b8._8_4_ * fVar16;
            auVar85._12_4_ = local_13b8._12_4_ * fVar17;
            auVar63 = vfmadd213ps_fma(auVar92,local_13c8,auVar85);
            auVar91 = vfmadd213ps_fma(auVar91,local_13d8,auVar63);
            auVar63 = vrcpps_avx(auVar79);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = &DAT_3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar92 = vfnmadd213ps_fma(auVar63,auVar79,auVar98);
            auVar63 = vfmadd132ps_fma(auVar92,auVar63,auVar63);
            local_13e8._0_4_ = auVar63._0_4_ * (auVar91._0_4_ + auVar91._0_4_);
            local_13e8._4_4_ = auVar63._4_4_ * (auVar91._4_4_ + auVar91._4_4_);
            local_13e8._8_4_ = auVar63._8_4_ * (auVar91._8_4_ + auVar91._8_4_);
            local_13e8._12_4_ = auVar63._12_4_ * (auVar91._12_4_ + auVar91._12_4_);
            uVar53 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar91._4_4_ = uVar53;
            auVar91._0_4_ = uVar53;
            auVar91._8_4_ = uVar53;
            auVar91._12_4_ = uVar53;
            auVar63 = vcmpps_avx(auVar91,local_13e8,2);
            uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar92._4_4_ = uVar53;
            auVar92._0_4_ = uVar53;
            auVar92._8_4_ = uVar53;
            auVar92._12_4_ = uVar53;
            auVar91 = vcmpps_avx(local_13e8,auVar92,2);
            auVar63 = vandps_avx(auVar91,auVar63);
            auVar91 = auVar87 & auVar63;
            if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar91[0xf] < '\0') {
              auVar87 = vandps_avx(auVar63,auVar87);
              auVar63 = vcmpps_avx(auVar79,_DAT_01feba10,4);
              auVar91 = auVar63 & auVar87;
              if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar91[0xf] < '\0') {
                local_1418 = vandps_avx(auVar87,auVar63);
                auVar87 = vrcpps_avx(local_1438);
                auVar67._8_4_ = 0x3f800000;
                auVar67._0_8_ = &DAT_3f8000003f800000;
                auVar67._12_4_ = 0x3f800000;
                auVar63 = vfnmadd213ps_fma(local_1438,auVar87,auVar67);
                auVar87 = vfmadd132ps_fma(auVar63,auVar87,auVar87);
                auVar65._8_4_ = 0x219392ef;
                auVar65._0_8_ = 0x219392ef219392ef;
                auVar65._12_4_ = 0x219392ef;
                auVar62 = vcmpps_avx(auVar62,auVar65,5);
                auVar62 = vandps_avx(auVar87,auVar62);
                auVar60._0_4_ = local_1458 * auVar62._0_4_;
                auVar60._4_4_ = fStack_1454 * auVar62._4_4_;
                auVar60._8_4_ = fStack_1450 * auVar62._8_4_;
                auVar60._12_4_ = fStack_144c * auVar62._12_4_;
                local_1408 = vminps_avx(auVar60,auVar67);
                auVar61._0_4_ = auVar62._0_4_ * local_1448._0_4_;
                auVar61._4_4_ = auVar62._4_4_ * local_1448._4_4_;
                auVar61._8_4_ = auVar62._8_4_ * local_1448._8_4_;
                auVar61._12_4_ = auVar62._12_4_ * local_1448._12_4_;
                local_13f8 = vminps_avx(auVar61,auVar67);
                uVar53 = vmovmskps_avx(local_1418);
                uVar47 = CONCAT44((int)(uVar47 >> 0x20),uVar53);
                do {
                  uVar43 = 0;
                  for (uVar45 = uVar47; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000
                      ) {
                    uVar43 = uVar43 + 1;
                  }
                  uVar5 = *(uint *)((long)&local_1468 + uVar43 * 4);
                  pGVar12 = (pSVar6->geometries).items[uVar5].ptr;
                  if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar47 = uVar47 ^ 1L << (uVar43 & 0x3f);
                    bVar56 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar56 = false;
                  }
                  else {
                    uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar45 = (ulong)(uint)((int)uVar43 * 4);
                    uVar3 = *(undefined4 *)(local_1408 + uVar45);
                    local_1378._4_4_ = uVar3;
                    local_1378._0_4_ = uVar3;
                    local_1378._8_4_ = uVar3;
                    local_1378._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)(local_13f8 + uVar45);
                    local_1368._4_4_ = uVar3;
                    local_1368._0_4_ = uVar3;
                    local_1368._8_4_ = uVar3;
                    local_1368._12_4_ = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_13e8 + uVar45);
                    args.context = context->user;
                    local_1348._4_4_ = uVar5;
                    local_1348._0_4_ = uVar5;
                    local_1348._8_4_ = uVar5;
                    local_1348._12_4_ = uVar5;
                    uVar3 = *(undefined4 *)((long)&local_1478 + uVar45);
                    local_1358._4_4_ = uVar3;
                    local_1358._0_4_ = uVar3;
                    local_1358._8_4_ = uVar3;
                    local_1358._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)(local_13d8 + uVar45);
                    uVar4 = *(undefined4 *)(local_13c8 + uVar45);
                    local_1398._4_4_ = uVar4;
                    local_1398._0_4_ = uVar4;
                    local_1398._8_4_ = uVar4;
                    local_1398._12_4_ = uVar4;
                    uVar4 = *(undefined4 *)(local_13b8 + uVar45);
                    local_1388._4_4_ = uVar4;
                    local_1388._0_4_ = uVar4;
                    local_1388._8_4_ = uVar4;
                    local_1388._12_4_ = uVar4;
                    local_13a8[0] = (RTCHitN)(char)uVar3;
                    local_13a8[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                    local_13a8[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                    local_13a8[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                    local_13a8[4] = (RTCHitN)(char)uVar3;
                    local_13a8[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                    local_13a8[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                    local_13a8[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                    local_13a8[8] = (RTCHitN)(char)uVar3;
                    local_13a8[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                    local_13a8[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                    local_13a8[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                    local_13a8[0xc] = (RTCHitN)(char)uVar3;
                    local_13a8[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                    local_13a8[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                    local_13a8[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_1348),ZEXT1632(local_1348));
                    uStack_1334 = (args.context)->instID[0];
                    local_1338 = uStack_1334;
                    uStack_1330 = uStack_1334;
                    uStack_132c = uStack_1334;
                    uStack_1328 = (args.context)->instPrimID[0];
                    uStack_1324 = uStack_1328;
                    uStack_1320 = uStack_1328;
                    uStack_131c = uStack_1328;
                    local_15a8 = *local_1598;
                    uStack_15a0 = local_1598[1];
                    args.valid = (int *)&local_15a8;
                    args.geometryUserPtr = pGVar12->userPtr;
                    args.hit = local_13a8;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar12->occlusionFilterN)(&args);
                    }
                    auVar38._8_8_ = uStack_15a0;
                    auVar38._0_8_ = local_15a8;
                    if (auVar38 == (undefined1  [16])0x0) {
                      auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar62 = auVar62 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&args);
                      }
                      auVar39._8_8_ = uStack_15a0;
                      auVar39._0_8_ = local_15a8;
                      auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,auVar39);
                      auVar62 = auVar87 ^ _DAT_01febe20;
                      auVar68._8_4_ = 0xff800000;
                      auVar68._0_8_ = 0xff800000ff800000;
                      auVar68._12_4_ = 0xff800000;
                      auVar87 = vblendvps_avx(auVar68,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar87);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar87;
                    }
                    auVar62 = vpslld_avx(auVar62,0x1f);
                    bVar36 = (auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar37 = (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar35 = (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar34 = -1 < auVar62[0xf];
                    bVar56 = ((bVar36 && bVar37) && bVar35) && bVar34;
                    if (((bVar36 && bVar37) && bVar35) && bVar34) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar53;
                      uVar47 = uVar47 ^ 1L << (uVar43 & 0x3f);
                    }
                  }
                  if (!bVar56) {
                    if (bVar55) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar54 = 1;
                    }
                    goto LAB_0064fedf;
                  }
                } while (uVar47 != 0);
                uVar47 = 0;
              }
            }
          }
          local_1588 = local_1588 + 1;
          bVar55 = local_1588 < local_1590;
        } while (local_1588 != local_1590);
      }
    }
LAB_0064fedf:
  } while ((uVar54 & 3) == 0);
  return local_1580 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }